

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O3

shared_ptr<Access> __thiscall Parser::offset(Parser *this,shared_ptr<Id> *a)

{
  element_type *peVar1;
  long lVar2;
  shared_ptr<Id> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<Access> sVar4;
  shared_ptr<Type> type;
  shared_ptr<Expr> loc;
  undefined1 local_c9;
  undefined1 local_c8 [16];
  shared_ptr<Type> local_b8;
  shared_ptr<Token> local_a8;
  shared_ptr<Expr> local_98;
  shared_ptr<Expr> local_88;
  shared_ptr<Expr> local_78;
  shared_ptr<Expr> local_68;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  element_type *local_40;
  shared_ptr<Id> *local_38;
  
  local_78.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_78.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_88.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_98.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58 = (element_type *)0x0;
  a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_68.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (in_RDX->super___shared_ptr<Id,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_b8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar1->super_Expr).type.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_b8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (peVar1->super_Expr).type.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if ((element_type *)
      local_b8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((element_type *)
                local_b8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               words)._M_t._M_impl =
           *(int *)&(((element_type *)
                     local_b8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                     )->words)._M_t._M_impl + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((element_type *)
                local_b8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               words)._M_t._M_impl =
           *(int *)&(((element_type *)
                     local_b8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                     )->words)._M_t._M_impl + 1;
    }
  }
  local_40 = (element_type *)this;
  local_38 = in_RDX;
  match((Parser *)a,0x5b);
  boolean((Parser *)local_c8);
  _Var3._M_pi = local_78.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_78.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_;
  local_78.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_c8._0_8_;
  local_c8._0_8_ = (element_type *)0x0;
  local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
    }
  }
  match((Parser *)a,0x5d);
  lVar2 = __dynamic_cast(local_b8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         &Type::typeinfo,&Array::typeinfo,0);
  _Var3._M_pi = local_b8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((element_type *)
      local_b8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Word>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Word>_>_>_>
                  *)&(local_b8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count)->_M_t)._M_impl =
           *(int *)&(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Word>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Word>_>_>_>
                       *)&(local_b8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                          ._M_pi)->_M_use_count)->_M_t)._M_impl + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Word>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Word>_>_>_>
                  *)&(local_b8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count)->_M_t)._M_impl =
           *(int *)&(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Word>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Word>_>_>_>
                       *)&(local_b8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                          ._M_pi)->_M_use_count)->_M_t)._M_impl + 1;
    }
  }
  local_b8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(lVar2 + 0x38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_b8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar2 + 0x40));
  if ((element_type *)_Var3._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
  }
  std::__shared_ptr<Constant,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<Constant>,int&>
            ((__shared_ptr<Constant,(__gnu_cxx::_Lock_policy)2> *)local_c8,
             (allocator<Constant> *)&local_a8,
             &(local_b8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->width);
  _Var3._M_pi = local_88.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_88.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_;
  local_88.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_c8._0_8_;
  local_c8._0_8_ = (element_type *)0x0;
  local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
    }
  }
  local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
       1;
  (local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
       = 1;
  (local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012aad0;
  local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
  local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR_toString_abi_cxx11__0012ab48;
  local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]._M_use_count =
       0x2a;
  std::__shared_ptr<Arith,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<Arith>,std::shared_ptr<Token>,std::shared_ptr<Expr>&,std::shared_ptr<Expr>&>
            ((__shared_ptr<Arith,(__gnu_cxx::_Lock_policy)2> *)local_c8,
             (allocator<Arith> *)&local_c9,&local_a8,&local_78,&local_88);
  _Var3._M_pi = local_98.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_98.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_;
  local_98.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_c8._0_8_;
  local_c8._0_8_ = (element_type *)0x0;
  local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
    }
  }
  if (local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_68.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_98.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_68.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_98.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if ((a[2].super___shared_ptr<Id,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count ==
      0x5b) {
    do {
      match((Parser *)a,0x5b);
      boolean((Parser *)local_c8);
      _Var3._M_pi = local_78.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_78.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_;
      local_78.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_c8._0_8_;
      local_c8._0_8_ = (element_type *)0x0;
      local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
        }
      }
      match((Parser *)a,0x5d);
      lVar2 = __dynamic_cast(local_b8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                             &Type::typeinfo,&Array::typeinfo,0);
      _Var3._M_pi = local_b8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((element_type *)
          local_b8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Word>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Word>_>_>_>
                      *)&(local_b8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count)->_M_t)._M_impl =
               *(int *)&(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Word>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Word>_>_>_>
                           *)&(local_b8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_M_use_count)->_M_t)._M_impl + 1;
          UNLOCK();
        }
        else {
          *(int *)&(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Word>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Word>_>_>_>
                      *)&(local_b8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count)->_M_t)._M_impl =
               *(int *)&(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Word>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Word>_>_>_>
                           *)&(local_b8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_M_use_count)->_M_t)._M_impl + 1;
        }
      }
      local_b8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)(lVar2 + 0x38);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_b8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar2 + 0x40));
      if ((element_type *)_Var3._M_pi != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
      }
      std::__shared_ptr<Constant,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<Constant>,int&>
                ((__shared_ptr<Constant,(__gnu_cxx::_Lock_policy)2> *)local_c8,
                 (allocator<Constant> *)&local_a8,
                 &(local_b8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->width);
      _Var3._M_pi = local_88.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_88.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_;
      local_88.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_c8._0_8_;
      local_c8._0_8_ = (element_type *)0x0;
      local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
        }
      }
      local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
      (local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = 1;
      (local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count = 1;
      (local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012aad0;
      local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
      local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _vptr__Sp_counted_base = (_func_int **)&PTR_toString_abi_cxx11__0012ab48;
      local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _M_use_count = 0x2a;
      std::__shared_ptr<Arith,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<Arith>,std::shared_ptr<Token>,std::shared_ptr<Expr>&,std::shared_ptr<Expr>&>
                ((__shared_ptr<Arith,(__gnu_cxx::_Lock_policy)2> *)local_c8,
                 (allocator<Arith> *)&local_c9,&local_a8,&local_78,&local_88);
      _Var3._M_pi = local_98.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_98.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_;
      local_98.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_c8._0_8_;
      local_c8._0_8_ = (element_type *)0x0;
      local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
        }
      }
      if (local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ;
      }
      local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
      (local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = 1;
      (local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count = 1;
      (local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012aad0;
      local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
      local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _vptr__Sp_counted_base = (_func_int **)&PTR_toString_abi_cxx11__0012ab48;
      local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _M_use_count = 0x2b;
      std::__shared_ptr<Arith,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<Arith>,std::shared_ptr<Token>,std::shared_ptr<Expr>&,std::shared_ptr<Expr>&>
                ((__shared_ptr<Arith,(__gnu_cxx::_Lock_policy)2> *)local_c8,
                 (allocator<Arith> *)&local_c9,&local_a8,&local_68,&local_98);
      _Var3._M_pi = a_Stack_50[0]._M_pi;
      a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_;
      local_58 = (element_type *)local_c8._0_8_;
      local_c8._0_8_ = (element_type *)0x0;
      local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
        }
      }
      if (local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a8.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ;
      }
      local_68.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_68.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 a_Stack_50);
    } while ((a[2].super___shared_ptr<Id,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count == 0x5b);
  }
  std::__shared_ptr<Access,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<Access>,std::shared_ptr<Id>&,std::shared_ptr<Expr>&,std::shared_ptr<Type>&>
            ((__shared_ptr<Access,(__gnu_cxx::_Lock_policy)2> *)local_40,
             (allocator<Access> *)local_c8,local_38,&local_68,&local_b8);
  _Var3._M_pi = extraout_RDX;
  if ((element_type *)
      local_b8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var3._M_pi = extraout_RDX_00;
  }
  if (local_68.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var3._M_pi = extraout_RDX_01;
  }
  if (a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
    _Var3._M_pi = extraout_RDX_02;
  }
  if (local_98.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var3._M_pi = extraout_RDX_03;
  }
  if (local_88.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var3._M_pi = extraout_RDX_04;
  }
  if (local_78.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var3._M_pi = extraout_RDX_05;
  }
  sVar4.super___shared_ptr<Access,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<Access,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_40;
  return (shared_ptr<Access>)sVar4.super___shared_ptr<Access,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Access> offset(std::shared_ptr<Id> a) {
		std::shared_ptr<Expr> i, w, t1, t2, loc;
		std::shared_ptr<Type> type = a->type;
		match('['); i = boolean(); match(']');
		type = (std::dynamic_pointer_cast<Array>(type))->of;
		w = std::make_shared<Constant>(type->width);
		t1 = std::make_shared<Arith>(std::make_shared<Token>('*'), i, w);
		loc = t1;
		while (look->tag == '[') {
			match('['); i = boolean(); match(']');
			type = (std::dynamic_pointer_cast<Array>(type))->of;
			w = std::make_shared<Constant>(type->width);
			t1 = std::make_shared<Arith>(std::make_shared<Token>('*'), i, w);
			t2 = std::make_shared<Arith>(std::make_shared<Token>('+'), loc, t1);
			loc = t2;
		}
		return std::make_shared<Access>(a, loc, type);
	}